

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,string_view name)

{
  string_view searchValue;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  shared_handle sharedEpt;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff60;
  undefined1 *puVar2;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_80;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffa0;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_48;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_30;
  size_t local_10;
  char *pcStack_8;
  
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffff98);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(&local_30);
  searchValue._M_str = pcStack_8;
  searchValue._M_len = local_10;
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffffa0,searchValue);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end(in_stack_ffffffffffffff60);
  bVar1 = gmlc::containers::
          BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::operator!=
                    (&local_48,&local_80);
  if (bVar1) {
    puVar2 = (undefined1 *)
             gmlc::containers::
             BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::operator*
                       (&local_48);
  }
  else {
    puVar2 = invalidEpt;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x36ce64);
  return (Endpoint *)puVar2;
}

Assistant:

const Endpoint& MessageFederateManager::getEndpoint(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock_shared();
    auto ept = sharedEpt->find(name);
    return (ept != sharedEpt.end()) ? (*ept) : invalidEpt;
}